

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

bool __thiscall QNetworkProxy::operator==(QNetworkProxy *this,QNetworkProxy *other)

{
  QNetworkProxyPrivate *pQVar1;
  QNetworkProxyPrivate *pQVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    bVar5 = true;
  }
  else {
    if ((((((pQVar1 != (QNetworkProxyPrivate *)0x0 && pQVar2 != (QNetworkProxyPrivate *)0x0) &&
           (pQVar2->type == pQVar1->type)) && (pQVar2->port == pQVar1->port)) &&
         ((lVar3 = (pQVar2->hostName).d.size, lVar3 == (pQVar1->hostName).d.size &&
          (QVar6.m_data = (pQVar2->hostName).d.ptr, QVar6.m_size = lVar3,
          QVar9.m_data = (pQVar1->hostName).d.ptr, QVar9.m_size = lVar3,
          cVar4 = QtPrivate::equalStrings(QVar6,QVar9), cVar4 != '\0')))) &&
        ((lVar3 = (pQVar2->user).d.size, lVar3 == (pQVar1->user).d.size &&
         ((QVar7.m_data = (pQVar2->user).d.ptr, QVar7.m_size = lVar3,
          QVar10.m_data = (pQVar1->user).d.ptr, QVar10.m_size = lVar3,
          cVar4 = QtPrivate::equalStrings(QVar7,QVar10), cVar4 != '\0' &&
          (lVar3 = (pQVar2->password).d.size, lVar3 == (pQVar1->password).d.size)))))) &&
       (QVar8.m_data = (pQVar2->password).d.ptr, QVar8.m_size = lVar3,
       QVar11.m_data = (pQVar1->password).d.ptr, QVar11.m_size = lVar3,
       cVar4 = QtPrivate::equalStrings(QVar8,QVar11), cVar4 != '\0')) {
      return (pQVar2->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
             super_QFlagsStorage<QNetworkProxy::Capability>.i ==
             (pQVar1->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
             super_QFlagsStorage<QNetworkProxy::Capability>.i;
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

constexpr P get() const noexcept { return ptr; }